

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_ventriloquate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *txt;
  CHAR_DATA *ch_00;
  long in_RDX;
  string buffer2;
  string buffer1;
  CHAR_DATA *vch;
  char speaker [4608];
  char *in_stack_ffffffffffffeb48;
  undefined4 in_stack_ffffffffffffeb50;
  undefined1 in_stack_ffffffffffffeb54;
  undefined1 in_stack_ffffffffffffeb55;
  undefined1 in_stack_ffffffffffffeb56;
  undefined1 in_stack_ffffffffffffeb57;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *__return_storage_ptr__;
  CHAR_DATA *victim;
  size_t *psVar5;
  char **local_1450;
  size_t local_1448;
  string local_1440 [32];
  char **local_1420 [2];
  string local_1410 [32];
  CHAR_DATA *local_13f0;
  v9 local_13e8 [408];
  format_args in_stack_ffffffffffffedb0;
  string_view in_stack_ffffffffffffedc0;
  char *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  local_1c8;
  undefined8 local_1a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_198;
  char **local_190;
  char **local_180;
  v9 *local_178;
  char **local_170;
  size_t sStack_168;
  string *local_160;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  local_158;
  undefined8 local_138;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_130;
  char **local_128;
  size_t local_120;
  char **local_118;
  v9 *local_110;
  char **local_108;
  size_t sStack_100;
  CHAR_DATA *local_f8;
  char *local_f0;
  char ***local_e8;
  char *local_e0;
  char ***local_d8;
  char *local_d0;
  char ***local_c8;
  char *local_c0;
  char ***local_b8;
  char ***local_b0;
  char **local_a8;
  size_t sStack_a0;
  char ***local_90;
  char **local_88;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_60;
  undefined8 local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_char_*>
  *local_18;
  char *local_10;
  char *local_8;
  
  target_name = one_argument((char *)CONCAT17(in_stack_ffffffffffffeb57,
                                              CONCAT16(in_stack_ffffffffffffeb56,
                                                       CONCAT15(in_stack_ffffffffffffeb55,
                                                                CONCAT14(in_stack_ffffffffffffeb54,
                                                                         in_stack_ffffffffffffeb50))
                                                      )),in_stack_ffffffffffffeb48);
  local_e8 = local_1420;
  local_f0 = "{} says \'{}\'.\n\r";
  local_c0 = "{} says \'{}\'.\n\r";
  local_1420[0] = (char **)0x7e4ccf;
  local_b8 = local_e8;
  local_120 = std::char_traits<char>::length((char_type *)0x61c31d);
  local_10 = local_f0;
  victim = (CHAR_DATA *)local_1410;
  local_108 = local_1420[0];
  local_118 = &target_name;
  local_b0 = &local_108;
  local_128 = local_1420[0];
  __return_storage_ptr__ = &local_158;
  local_110 = local_13e8;
  sStack_100 = local_120;
  local_f8 = victim;
  local_a8 = local_128;
  sStack_a0 = local_120;
  fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char*&>
            (__return_storage_ptr__,local_13e8,(char (*) [4608])&target_name,local_1420[0]);
  local_68 = &local_138;
  local_58 = 0xcc;
  local_138 = 0xcc;
  local_70 = __return_storage_ptr__;
  local_60 = __return_storage_ptr__;
  local_50 = local_68;
  local_18 = __return_storage_ptr__;
  local_130 = __return_storage_ptr__;
  fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb0);
  local_d8 = &local_1450;
  local_e0 = "Someone makes {} say \'{}\'.\n\r";
  local_d0 = "Someone makes {} say \'{}\'.\n\r";
  local_1450 = (char **)0x7e4cdf;
  psVar5 = &local_1448;
  local_c8 = local_d8;
  sVar4 = std::char_traits<char>::length((char_type *)0x61c4f4);
  *psVar5 = sVar4;
  local_8 = local_e0;
  local_160 = local_1440;
  local_170 = local_1450;
  sStack_168 = local_1448;
  local_178 = local_13e8;
  local_180 = &target_name;
  local_90 = &local_170;
  local_190 = local_1450;
  local_88 = local_190;
  fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char*&>
            (&local_1c8,local_178,(char (*) [4608])&target_name,local_1450);
  local_40 = &local_1a0;
  local_48 = &local_1c8;
  local_30 = 0xcc;
  local_1a0 = 0xcc;
  local_38 = local_48;
  local_28 = local_40;
  local_20 = local_48;
  local_198 = local_48;
  fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb0);
  txt = (char *)std::__cxx11::string::operator[]((ulong)local_1410);
  iVar3 = toupper((int)*txt);
  uVar1 = (undefined1)iVar3;
  ch_00 = (CHAR_DATA *)std::__cxx11::string::operator[]((ulong)local_1410);
  *(undefined1 *)&ch_00->next = uVar1;
  for (local_13f0 = *(CHAR_DATA **)(*(long *)(in_RDX + 0xa8) + 0x18); local_13f0 != (CHAR_DATA *)0x0
      ; local_13f0 = local_13f0->next_in_room) {
    bVar2 = is_exact_name(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    if ((!bVar2) && (bVar2 = is_awake(local_13f0), bVar2)) {
      bVar2 = saves_spell((int)psVar5,victim,(int)((ulong)__return_storage_ptr__ >> 0x20));
      if (bVar2) {
        std::__cxx11::string::c_str();
      }
      else {
        std::__cxx11::string::c_str();
      }
      send_to_char(txt,ch_00);
    }
  }
  std::__cxx11::string::~string(local_1440);
  std::__cxx11::string::~string(local_1410);
  return;
}

Assistant:

void spell_ventriloquate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char speaker[MAX_INPUT_LENGTH];
	CHAR_DATA *vch;

	target_name = one_argument(target_name, speaker);

	auto buffer1 = fmt::format("{} says '{}'.\n\r", speaker, target_name);
	auto buffer2 = fmt::format("Someone makes {} say '{}'.\n\r", speaker, target_name);
	buffer1[0] = toupper(buffer1[0]);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (!is_exact_name(speaker, vch->name) && is_awake(vch))
			send_to_char(saves_spell(level, vch, DAM_OTHER) ? buffer2.c_str() : buffer1.c_str(), vch);
	}
}